

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_slb.c
# Opt level: O1

int slbLoadEntries(PHYSFS_Io *io,PHYSFS_uint32 count,void *arc)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  PHYSFS_uint32 PVar4;
  char backslash;
  PHYSFS_uint32 pos;
  PHYSFS_uint32 size;
  char name [64];
  char local_81;
  PHYSFS_uint32 local_80;
  PHYSFS_uint32 local_7c;
  char local_78 [63];
  undefined1 local_39;
  
  if (count == 0) {
    return 1;
  }
  PVar4 = 0;
LAB_001197b7:
  iVar1 = __PHYSFS_readAll(io,&local_81,1);
  if (iVar1 == 0) {
    return 0;
  }
  if (local_81 != '\\') {
    PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
    return 0;
  }
  iVar1 = __PHYSFS_readAll(io,local_78,0x3f);
  if (iVar1 == 0) {
    return 0;
  }
  local_39 = 0;
  pcVar2 = local_78;
  do {
    if (*pcVar2 == '\\') {
      *pcVar2 = '/';
    }
    else if (*pcVar2 == '\0') break;
    pcVar2 = pcVar2 + 1;
  } while( true );
  iVar1 = __PHYSFS_readAll(io,&local_80,4);
  if (iVar1 != 0) {
    local_80 = PHYSFS_swapULE32(local_80);
    iVar1 = __PHYSFS_readAll(io,&local_7c,4);
    if (iVar1 != 0) {
      local_7c = PHYSFS_swapULE32(local_7c);
      pvVar3 = UNPK_addEntry(arc,local_78,0,-1,-1,(ulong)local_80,(ulong)local_7c);
      if (pvVar3 == (void *)0x0) {
        return 0;
      }
      PVar4 = PVar4 + 1;
      if (PVar4 == count) {
        return 1;
      }
      goto LAB_001197b7;
    }
  }
  return 0;
}

Assistant:

static int slbLoadEntries(PHYSFS_Io *io, const PHYSFS_uint32 count, void *arc)
{
    PHYSFS_uint32 i;
    for (i = 0; i < count; i++)
    {
        PHYSFS_uint32 pos;
        PHYSFS_uint32 size;
        char name[64];
        char backslash;
        char *ptr;

        /* don't include the '\' in the beginning */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &backslash, 1), 0);
        BAIL_IF(backslash != '\\', PHYSFS_ERR_CORRUPT, 0);

        /* read the rest of the buffer, 63 bytes */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &name, 63), 0);
        name[63] = '\0'; /* in case the name lacks the null terminator */

        /* convert backslashes */
        for (ptr = name; *ptr; ptr++)
        {
            if (*ptr == '\\')
                *ptr = '/';
        } /* for */

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &pos, 4), 0);
        pos = PHYSFS_swapULE32(pos);

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &size, 4), 0);
        size = PHYSFS_swapULE32(size);

        BAIL_IF_ERRPASS(!UNPK_addEntry(arc, name, 0, -1, -1, pos, size), 0);
    } /* for */

    return 1;
}